

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::vresize_one(short *rows0p,short *rows1p,int wsize,uchar *Dp,short b0,short b1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 *in_RCX;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  short in_R8W;
  short in_R9W;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i _acc1;
  __m128i _acc0;
  __m128i _r11;
  __m128i _r10;
  __m128i _r01;
  __m128i _r00;
  __m128i _v2;
  __m128i _b1;
  __m128i _b0;
  int dx;
  int local_328;
  undefined8 *local_320;
  undefined1 (*local_310) [16];
  undefined1 (*local_308) [16];
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short s1;
  short s0;
  __m128i _Dp_1;
  __m128i _acc;
  __m128i _r1;
  __m128i _r0;
  __m128i _Dp;
  
  uVar8 = CONCAT26(in_R8W,CONCAT24(in_R8W,CONCAT22(in_R8W,in_R8W)));
  uVar9 = CONCAT26(in_R8W,CONCAT24(in_R8W,CONCAT22(in_R8W,in_R8W)));
  uVar10 = CONCAT26(in_R9W,CONCAT24(in_R9W,CONCAT22(in_R9W,in_R9W)));
  uVar11 = CONCAT26(in_R9W,CONCAT24(in_R9W,CONCAT22(in_R9W,in_R9W)));
  local_320 = in_RCX;
  local_310 = in_RSI;
  local_308 = in_RDI;
  for (local_328 = 0; local_328 + 0xf < in_EDX; local_328 = local_328 + 0x10) {
    auVar4._8_8_ = uVar9;
    auVar4._0_8_ = uVar8;
    auVar13 = pmulhw(*local_308,auVar4);
    auVar3._8_8_ = uVar11;
    auVar3._0_8_ = uVar10;
    auVar12 = pmulhw(*local_310,auVar3);
    local_218 = auVar13._0_2_;
    sStack_216 = auVar13._2_2_;
    sStack_214 = auVar13._4_2_;
    sStack_212 = auVar13._6_2_;
    sStack_210 = auVar13._8_2_;
    sStack_20e = auVar13._10_2_;
    sStack_20c = auVar13._12_2_;
    sStack_20a = auVar13._14_2_;
    local_228 = auVar12._0_2_;
    sStack_226 = auVar12._2_2_;
    sStack_224 = auVar12._4_2_;
    sStack_222 = auVar12._6_2_;
    sStack_220 = auVar12._8_2_;
    sStack_21e = auVar12._10_2_;
    sStack_21c = auVar12._12_2_;
    sStack_21a = auVar12._14_2_;
    auVar13._8_8_ = uVar9;
    auVar13._0_8_ = uVar8;
    auVar13 = pmulhw(local_308[1],auVar13);
    auVar12._8_8_ = uVar11;
    auVar12._0_8_ = uVar10;
    auVar12 = pmulhw(local_310[1],auVar12);
    local_238 = auVar13._0_2_;
    sStack_236 = auVar13._2_2_;
    sStack_234 = auVar13._4_2_;
    sStack_232 = auVar13._6_2_;
    sStack_230 = auVar13._8_2_;
    sStack_22e = auVar13._10_2_;
    sStack_22c = auVar13._12_2_;
    sStack_22a = auVar13._14_2_;
    local_248 = auVar12._0_2_;
    sStack_246 = auVar12._2_2_;
    sStack_244 = auVar12._4_2_;
    sStack_242 = auVar12._6_2_;
    sStack_240 = auVar12._8_2_;
    sStack_23e = auVar12._10_2_;
    sStack_23c = auVar12._12_2_;
    sStack_23a = auVar12._14_2_;
    auVar7._2_2_ = sStack_216 + sStack_226 + 2;
    auVar7._0_2_ = local_218 + local_228 + 2;
    auVar7._4_2_ = sStack_214 + sStack_224 + 2;
    auVar7._6_2_ = sStack_212 + sStack_222 + 2;
    auVar7._8_2_ = sStack_210 + sStack_220 + 2;
    auVar7._10_2_ = sStack_20e + sStack_21e + 2;
    auVar7._12_2_ = sStack_20c + sStack_21c + 2;
    auVar7._14_2_ = sStack_20a + sStack_21a + 2;
    auVar12 = psraw(auVar7,ZEXT416(2));
    auVar6._2_2_ = sStack_236 + sStack_246 + 2;
    auVar6._0_2_ = local_238 + local_248 + 2;
    auVar6._4_2_ = sStack_234 + sStack_244 + 2;
    auVar6._6_2_ = sStack_232 + sStack_242 + 2;
    auVar6._8_2_ = sStack_230 + sStack_240 + 2;
    auVar6._10_2_ = sStack_22e + sStack_23e + 2;
    auVar6._12_2_ = sStack_22c + sStack_23c + 2;
    auVar6._14_2_ = sStack_22a + sStack_23a + 2;
    auVar13 = psraw(auVar6,ZEXT416(2));
    local_b8 = auVar12._0_2_;
    sStack_b6 = auVar12._2_2_;
    sStack_b4 = auVar12._4_2_;
    sStack_b2 = auVar12._6_2_;
    sStack_b0 = auVar12._8_2_;
    sStack_ae = auVar12._10_2_;
    sStack_ac = auVar12._12_2_;
    sStack_aa = auVar12._14_2_;
    local_c8 = auVar13._0_2_;
    sStack_c6 = auVar13._2_2_;
    sStack_c4 = auVar13._4_2_;
    sStack_c2 = auVar13._6_2_;
    sStack_c0 = auVar13._8_2_;
    sStack_be = auVar13._10_2_;
    sStack_bc = auVar13._12_2_;
    sStack_ba = auVar13._14_2_;
    *local_320 = CONCAT17((0 < sStack_aa) * (sStack_aa < 0x100) * auVar12[0xe] - (0xff < sStack_aa),
                          CONCAT16((0 < sStack_ac) * (sStack_ac < 0x100) * auVar12[0xc] -
                                   (0xff < sStack_ac),
                                   CONCAT15((0 < sStack_ae) * (sStack_ae < 0x100) * auVar12[10] -
                                            (0xff < sStack_ae),
                                            CONCAT14((0 < sStack_b0) * (sStack_b0 < 0x100) *
                                                     auVar12[8] - (0xff < sStack_b0),
                                                     CONCAT13((0 < sStack_b2) * (sStack_b2 < 0x100)
                                                              * auVar12[6] - (0xff < sStack_b2),
                                                              CONCAT12((0 < sStack_b4) *
                                                                       (sStack_b4 < 0x100) *
                                                                       auVar12[4] -
                                                                       (0xff < sStack_b4),
                                                                       CONCAT11((0 < sStack_b6) *
                                                                                (sStack_b6 < 0x100)
                                                                                * auVar12[2] -
                                                                                (0xff < sStack_b6),
                                                                                (0 < local_b8) *
                                                                                (local_b8 < 0x100) *
                                                                                auVar12[0] -
                                                                                (0xff < local_b8))))
                                                    ))));
    local_320[1] = CONCAT17((0 < sStack_ba) * (sStack_ba < 0x100) * auVar13[0xe] -
                            (0xff < sStack_ba),
                            CONCAT16((0 < sStack_bc) * (sStack_bc < 0x100) * auVar13[0xc] -
                                     (0xff < sStack_bc),
                                     CONCAT15((0 < sStack_be) * (sStack_be < 0x100) * auVar13[10] -
                                              (0xff < sStack_be),
                                              CONCAT14((0 < sStack_c0) * (sStack_c0 < 0x100) *
                                                       auVar13[8] - (0xff < sStack_c0),
                                                       CONCAT13((0 < sStack_c2) *
                                                                (sStack_c2 < 0x100) * auVar13[6] -
                                                                (0xff < sStack_c2),
                                                                CONCAT12((0 < sStack_c4) *
                                                                         (sStack_c4 < 0x100) *
                                                                         auVar13[4] -
                                                                         (0xff < sStack_c4),
                                                                         CONCAT11((0 < sStack_c6) *
                                                                                  (sStack_c6 < 0x100
                                                                                  ) * auVar13[2] -
                                                                                  (0xff < sStack_c6)
                                                                                  ,(0 < local_c8) *
                                                                                   (local_c8 < 0x100
                                                                                   ) * auVar13[0] -
                                                                                   (0xff < local_c8)
                                                                                 )))))));
    local_320 = local_320 + 2;
    local_308 = local_308 + 2;
    local_310 = local_310 + 2;
  }
  for (; local_328 + 7 < in_EDX; local_328 = local_328 + 8) {
    auVar2._8_8_ = uVar9;
    auVar2._0_8_ = uVar8;
    auVar13 = pmulhw(*local_308,auVar2);
    auVar1._8_8_ = uVar11;
    auVar1._0_8_ = uVar10;
    auVar12 = pmulhw(*local_310,auVar1);
    local_298 = auVar13._0_2_;
    sStack_296 = auVar13._2_2_;
    sStack_294 = auVar13._4_2_;
    sStack_292 = auVar13._6_2_;
    sStack_290 = auVar13._8_2_;
    sStack_28e = auVar13._10_2_;
    sStack_28c = auVar13._12_2_;
    sStack_28a = auVar13._14_2_;
    local_2a8 = auVar12._0_2_;
    sStack_2a6 = auVar12._2_2_;
    sStack_2a4 = auVar12._4_2_;
    sStack_2a2 = auVar12._6_2_;
    sStack_2a0 = auVar12._8_2_;
    sStack_29e = auVar12._10_2_;
    sStack_29c = auVar12._12_2_;
    sStack_29a = auVar12._14_2_;
    auVar5._2_2_ = sStack_296 + sStack_2a6 + 2;
    auVar5._0_2_ = local_298 + local_2a8 + 2;
    auVar5._4_2_ = sStack_294 + sStack_2a4 + 2;
    auVar5._6_2_ = sStack_292 + sStack_2a2 + 2;
    auVar5._8_2_ = sStack_290 + sStack_2a0 + 2;
    auVar5._10_2_ = sStack_28e + sStack_29e + 2;
    auVar5._12_2_ = sStack_28c + sStack_29c + 2;
    auVar5._14_2_ = sStack_28a + sStack_29a + 2;
    auVar12 = psraw(auVar5,ZEXT416(2));
    local_d8 = auVar12._0_2_;
    sStack_d6 = auVar12._2_2_;
    sStack_d4 = auVar12._4_2_;
    sStack_d2 = auVar12._6_2_;
    sStack_d0 = auVar12._8_2_;
    sStack_ce = auVar12._10_2_;
    sStack_cc = auVar12._12_2_;
    sStack_ca = auVar12._14_2_;
    *local_320 = CONCAT17((0 < sStack_ca) * (sStack_ca < 0x100) * auVar12[0xe] - (0xff < sStack_ca),
                          CONCAT16((0 < sStack_cc) * (sStack_cc < 0x100) * auVar12[0xc] -
                                   (0xff < sStack_cc),
                                   CONCAT15((0 < sStack_ce) * (sStack_ce < 0x100) * auVar12[10] -
                                            (0xff < sStack_ce),
                                            CONCAT14((0 < sStack_d0) * (sStack_d0 < 0x100) *
                                                     auVar12[8] - (0xff < sStack_d0),
                                                     CONCAT13((0 < sStack_d2) * (sStack_d2 < 0x100)
                                                              * auVar12[6] - (0xff < sStack_d2),
                                                              CONCAT12((0 < sStack_d4) *
                                                                       (sStack_d4 < 0x100) *
                                                                       auVar12[4] -
                                                                       (0xff < sStack_d4),
                                                                       CONCAT11((0 < sStack_d6) *
                                                                                (sStack_d6 < 0x100)
                                                                                * auVar12[2] -
                                                                                (0xff < sStack_d6),
                                                                                (0 < local_d8) *
                                                                                (local_d8 < 0x100) *
                                                                                auVar12[0] -
                                                                                (0xff < local_d8))))
                                                    ))));
    local_320 = local_320 + 1;
    local_308 = local_308 + 1;
    local_310 = local_310 + 1;
  }
  for (; local_328 < in_EDX; local_328 = local_328 + 1) {
    *(char *)local_320 =
         (char)((int)(short)((uint)((int)in_R8W * (int)*(short *)*local_308) >> 0x10) +
                (int)(short)((uint)((int)in_R9W * (int)*(short *)*local_310) >> 0x10) + 2 >> 2);
    local_320 = (undefined8 *)((long)local_320 + 1);
    local_310 = (undefined1 (*) [16])(*local_310 + 2);
    local_308 = (undefined1 (*) [16])(*local_308 + 2);
  }
  return;
}

Assistant:

static void vresize_one(const short* rows0p, const short* rows1p, int wsize, unsigned char* Dp, short b0, short b1)
{
    int dx = 0;
#if __ARM_NEON
    int16x8_t _b0 = vdupq_n_s16(b0);
    int16x8_t _b1 = vdupq_n_s16(b1);
    for (; dx + 15 < wsize; dx += 16)
    {
        int16x8_t _r00 = vld1q_s16(rows0p);
        int16x8_t _r01 = vld1q_s16(rows0p + 8);
        int16x8_t _r10 = vld1q_s16(rows1p);
        int16x8_t _r11 = vld1q_s16(rows1p + 8);
        int16x8_t _acc0 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b0), 1), vqdmulhq_s16(_r10, _b1), 1);
        int16x8_t _acc1 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b0), 1), vqdmulhq_s16(_r11, _b1), 1);
        uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 2), vqrshrun_n_s16(_acc1, 2));
        vst1q_u8(Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        int16x8_t _r0 = vld1q_s16(rows0p);
        int16x8_t _r1 = vld1q_s16(rows1p);
        int16x8_t _acc = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b0), 1), vqdmulhq_s16(_r1, _b1), 1);
        uint8x8_t _Dp = vqrshrun_n_s16(_acc, 2);
        vst1_u8(Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __ARM_NEON
#if __SSE2__
    __m128i _b0 = _mm_set1_epi16(b0);
    __m128i _b1 = _mm_set1_epi16(b1);
    __m128i _v2 = _mm_set1_epi16(2);
    for (; dx + 15 < wsize; dx += 16)
    {
        __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
        __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
        __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
        __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
        _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
        _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
        _mm_storeu_si128((__m128i*)Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
        _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc, _acc);
        _mm_storel_epi64((__m128i*)Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __SSE2__
    for (; dx < wsize; dx++)
    {
        short s0 = *rows0p++;
        short s1 = *rows1p++;

        *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
    }
}